

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<std::__cxx11::string,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,char (*args) [2],
          char *args_1,char (*args_2) [2],char *args_3)

{
  undefined8 in_RDI;
  char (*in_R8) [2];
  char *in_R9;
  string *in_stack_ffffffffffffff68;
  string local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_50 [16];
  char *in_stack_ffffffffffffffc0;
  char (*in_stack_ffffffffffffffc8) [2];
  
  StringBuilder(in_stack_ffffffffffffff68);
  StringBuilder<char[2],char_const&,char_const(&)[2],char_const&>
            (in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}